

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryFileLockController::CreateFileLock
          (CSharedMemoryFileLockController *this,CPalThread *pThread,DWORD dwOffsetLow,
          DWORD dwOffsetHigh,DWORD nNumberOfBytesToLockLow,DWORD nNumberOfBytesToLockHigh,
          FileLockExclusivity eFileLockExclusivity,FileLockWaitMode eFileLockWaitMode)

{
  UINT64 nbBytesToLock;
  UINT64 lockRgnStart;
  PAL_ERROR palError;
  DWORD nNumberOfBytesToLockHigh_local;
  DWORD nNumberOfBytesToLockLow_local;
  DWORD dwOffsetHigh_local;
  DWORD dwOffsetLow_local;
  CPalThread *pThread_local;
  CSharedMemoryFileLockController *this_local;
  
  if ((eFileLockExclusivity == ExclusiveFileLock) && (eFileLockWaitMode == FailImmediately)) {
    lockRgnStart._4_4_ =
         FILELockFileRegion(this->m_shmFileLocks,this,CONCAT44(dwOffsetHigh,dwOffsetLow),
                            CONCAT44(nNumberOfBytesToLockHigh,nNumberOfBytesToLockLow),USER_LOCK_RGN
                           );
  }
  else {
    fprintf(_stderr,"] %s %s:%d","CreateFileLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
            ,0x178);
    fprintf(_stderr,"LockFileEx functionality not yet supported");
    lockRgnStart._4_4_ = 0x32;
  }
  return lockRgnStart._4_4_;
}

Assistant:

PAL_ERROR
CSharedMemoryFileLockController::CreateFileLock(
    CPalThread *pThread,                // IN, OPTIONAL
    DWORD dwOffsetLow,
    DWORD dwOffsetHigh,
    DWORD nNumberOfBytesToLockLow,
    DWORD nNumberOfBytesToLockHigh,
    FileLockExclusivity eFileLockExclusivity,
    FileLockWaitMode eFileLockWaitMode
    )
{
    PAL_ERROR palError = NO_ERROR;
    UINT64 lockRgnStart;
    UINT64 nbBytesToLock;

    if (ExclusiveFileLock != eFileLockExclusivity
        || FailImmediately != eFileLockWaitMode)
    {
        ASSERT("LockFileEx functionality not yet supported");
        palError = ERROR_NOT_SUPPORTED;
        goto CreateFileLockExit;
    }

    lockRgnStart  = ((UINT64)dwOffsetHigh) << 32  | dwOffsetLow;
    nbBytesToLock = ((UINT64)nNumberOfBytesToLockHigh) << 32  | 
                             nNumberOfBytesToLockLow;

    palError = FILELockFileRegion(
        m_shmFileLocks,
        reinterpret_cast<PVOID>(this),
        lockRgnStart, 
        nbBytesToLock,
        USER_LOCK_RGN
        );

CreateFileLockExit:

    return palError;
}